

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O1

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,true>::flush_output
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,true> *this)

{
  int in_ESI;
  
  ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_true>::flush_output
            ((ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_true> *)(this + -8),
             in_ESI);
  return;
}

Assistant:

void flush_output(int outputs) final {
			update_just_in_time_cards();

			if(outputs & Output::Video) {
				update_video();
			}
			if(outputs & Output::Audio) {
				update_audio();
				audio_queue_.perform();
			}
		}